

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O3

float __thiscall
poisson_loss::getUpdate
          (poisson_loss *this,float prediction,float label,float update_scale,float pred_per_update)

{
  float fVar1;
  float fVar2;
  
  fVar1 = expf(prediction);
  if (0.0 < label) {
    fVar2 = expm1f(update_scale * label * pred_per_update);
    fVar1 = log1pf((fVar2 * fVar1) / label);
    return update_scale * label - fVar1 / pred_per_update;
  }
  fVar1 = log1pf(fVar1 * update_scale * pred_per_update);
  return -fVar1 / pred_per_update;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float exp_prediction = expf(prediction);
    if (label > 0)
    {
      return label * update_scale -
          log1p(exp_prediction * expm1(label * update_scale * pred_per_update) / label) / pred_per_update;
    }
    else
    {
      return -log1p(exp_prediction * update_scale * pred_per_update) / pred_per_update;
    }
  }